

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

void __thiscall value_none::test_method(value_none *this)

{
  undefined1 uVar1;
  Value value1;
  Value value;
  output_test_stream output;
  Value local_290 [16];
  Value local_280 [16];
  char *local_270;
  char *local_268;
  shared_count local_260;
  undefined **local_258;
  ulong local_250;
  shared_count sStack_248;
  char **local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined **local_1a8;
  undefined1 local_1a0;
  undefined8 *local_198;
  char **local_190;
  
  dynamicgraph::command::Value::Value(local_290);
  dynamicgraph::command::Value::Value(local_280,local_290);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x20);
  uVar1 = dynamicgraph::command::Value::operator==(local_290,local_280);
  local_258 = (undefined **)(CONCAT71(local_258._1_7_,uVar1) ^ 1);
  local_250 = 0;
  sStack_248.pi_ = (sp_counted_base *)0x0;
  local_190 = &local_270;
  local_270 = "!(value1 == value)";
  local_268 = "";
  local_1a0 = 0;
  local_1a8 = &PTR__lazy_ostream_00112c28;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1d0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_248);
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)&local_1a8,&local_1e8,1,1);
  dynamicgraph::command::operator<<((ostream *)&local_1a8,local_290);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x25);
  local_218 = "Type=unknown, value=";
  local_210 = "";
  boost::test_tools::output_test_stream::is_equal(&local_270,&local_1a8,&local_218,1);
  local_240 = &local_228;
  local_228 = "output.is_equal(\"Type=unknown, value=\")";
  local_220 = "";
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_00112c28;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_230 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_258,&local_238,0x25,1,0,0);
  boost::detail::shared_count::~shared_count(&local_260);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)&local_1a8);
  dynamicgraph::command::Value::~Value(local_280);
  dynamicgraph::command::Value::~Value(local_290);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_none) {
  using dg::command::Value;

  Value value1;
  Value value(value1);

  // Similar to NaN != NaN
  BOOST_CHECK(!(value1 == value));

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=unknown, value="));
  }
}